

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  undefined1 _aborting;
  undefined1 uVar1;
  uint uVar2;
  IStreamingReporter *pIVar3;
  Totals *this_00;
  TestCaseStats *this_01;
  TestCase *in_RDX;
  Totals *in_RSI;
  Totals *in_RDI;
  TestCaseInfo testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string *in_stack_000004d0;
  string *in_stack_000004d8;
  RunContext *in_stack_000004e0;
  string *in_stack_fffffffffffffc18;
  TestCaseTracker *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2c;
  byte in_stack_fffffffffffffc2d;
  undefined1 in_stack_fffffffffffffc2e;
  byte bVar4;
  undefined1 in_stack_fffffffffffffc2f;
  Option<Catch::SectionTracking::TestCaseTracker> *in_stack_fffffffffffffc30;
  byte local_3c2;
  Totals *_stdOut;
  TestCaseInfo *in_stack_fffffffffffffc58;
  TestCaseStats *in_stack_fffffffffffffc60;
  undefined1 local_198 [272];
  string local_88 [32];
  string local_68 [32];
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  size_t sStack_20;
  TestCase *local_10;
  
  local_48 = in_RSI[7].testCases.failedButOk;
  sStack_40 = in_RSI[8].assertions.passed;
  local_38 = in_RSI[8].assertions.failed;
  sStack_30 = in_RSI[8].assertions.failedButOk;
  local_28 = in_RSI[8].testCases.passed;
  sStack_20 = in_RSI[8].testCases.failed;
  _stdOut = in_RDI;
  local_10 = in_RDX;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  TestCase::getTestCaseInfo(local_10);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RSI[8].testCases.failedButOk);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,local_198);
  in_RSI[1].assertions.failed = (size_t)local_10;
  SectionTracking::TestCaseTracker::TestCaseTracker
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  Option<Catch::SectionTracking::TestCaseTracker>::operator=
            (in_stack_fffffffffffffc30,
             (TestCaseTracker *)
             CONCAT17(in_stack_fffffffffffffc2f,
                      CONCAT16(in_stack_fffffffffffffc2e,
                               CONCAT15(in_stack_fffffffffffffc2d,
                                        CONCAT14(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28
                                                )))));
  SectionTracking::TestCaseTracker::~TestCaseTracker((TestCaseTracker *)0x1a9e48);
  do {
    do {
      runCurrentTest(in_stack_000004e0,in_stack_000004d8,in_stack_000004d0);
      Option<Catch::SectionTracking::TestCaseTracker>::operator->
                ((Option<Catch::SectionTracking::TestCaseTracker> *)
                 &in_RSI[1].assertions.failedButOk);
      _aborting = SectionTracking::TestCaseTracker::isCompleted((TestCaseTracker *)0x1a9e7e);
      local_3c2 = 0;
      if (!(bool)_aborting) {
        local_3c2 = (**(code **)((in_RSI->assertions).passed + 0x48))();
        local_3c2 = local_3c2 ^ 0xff;
      }
    } while ((local_3c2 & 1) != 0);
    this_00 = (Totals *)getCurrentContext();
    uVar2 = (*((_func_int **)(this_00->assertions).passed)[5])();
    uVar1 = (undefined1)uVar2;
    bVar4 = 0;
    if ((uVar2 & 1) != 0) {
      in_stack_fffffffffffffc2d = (**(code **)((in_RSI->assertions).passed + 0x48))();
      bVar4 = in_stack_fffffffffffffc2d ^ 0xff;
    }
  } while ((bVar4 & 1) != 0);
  Totals::delta(this_00,(Totals *)
                        CONCAT17(uVar1,CONCAT16(bVar4,CONCAT15(in_stack_fffffffffffffc2d,
                                                               CONCAT14(in_stack_fffffffffffffc2c,
                                                                        in_stack_fffffffffffffc28)))
                                ));
  Counts::operator+=((Counts *)&in_RSI[8].assertions.failedButOk,&in_RDI->testCases);
  this_01 = (TestCaseStats *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)&in_RSI[8].testCases.failedButOk);
  (**(code **)((in_RSI->assertions).passed + 0x48))();
  TestCaseStats::TestCaseStats
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_RSI,(string *)_stdOut,
             (string *)in_RDI,(bool)_aborting);
  (*(((IShared *)&this_01->_vptr_TestCaseStats)->super_NonCopyable)._vptr_NonCopyable[0xd])
            (this_01,&stack0xfffffffffffffc58);
  TestCaseStats::~TestCaseStats(this_01);
  in_RSI[1].assertions.failed = 0;
  Option<Catch::SectionTracking::TestCaseTracker>::reset
            ((Option<Catch::SectionTracking::TestCaseTracker> *)this_01);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)this_01);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return _stdOut;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }